

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zipkincore_constants.cpp
# Opt level: O2

void __thiscall
twitter::zipkin::thrift::zipkincoreConstants::zipkincoreConstants(zipkincoreConstants *this)

{
  (this->CLIENT_SEND)._M_dataplus._M_p = (pointer)&(this->CLIENT_SEND).field_2;
  (this->CLIENT_SEND)._M_string_length = 0;
  (this->CLIENT_SEND).field_2._M_local_buf[0] = '\0';
  (this->CLIENT_RECV)._M_dataplus._M_p = (pointer)&(this->CLIENT_RECV).field_2;
  (this->CLIENT_RECV)._M_string_length = 0;
  (this->CLIENT_RECV).field_2._M_local_buf[0] = '\0';
  (this->SERVER_SEND)._M_dataplus._M_p = (pointer)&(this->SERVER_SEND).field_2;
  (this->SERVER_SEND)._M_string_length = 0;
  (this->SERVER_SEND).field_2._M_local_buf[0] = '\0';
  (this->SERVER_RECV)._M_dataplus._M_p = (pointer)&(this->SERVER_RECV).field_2;
  (this->SERVER_RECV)._M_string_length = 0;
  (this->SERVER_RECV).field_2._M_local_buf[0] = '\0';
  (this->MESSAGE_SEND)._M_dataplus._M_p = (pointer)&(this->MESSAGE_SEND).field_2;
  (this->MESSAGE_SEND)._M_string_length = 0;
  (this->MESSAGE_SEND).field_2._M_local_buf[0] = '\0';
  (this->MESSAGE_RECV)._M_dataplus._M_p = (pointer)&(this->MESSAGE_RECV).field_2;
  (this->MESSAGE_RECV)._M_string_length = 0;
  (this->MESSAGE_RECV).field_2._M_local_buf[0] = '\0';
  (this->WIRE_SEND)._M_dataplus._M_p = (pointer)&(this->WIRE_SEND).field_2;
  (this->WIRE_SEND)._M_string_length = 0;
  (this->WIRE_SEND).field_2._M_local_buf[0] = '\0';
  (this->WIRE_RECV)._M_dataplus._M_p = (pointer)&(this->WIRE_RECV).field_2;
  (this->WIRE_RECV)._M_string_length = 0;
  (this->WIRE_RECV).field_2._M_local_buf[0] = '\0';
  (this->CLIENT_SEND_FRAGMENT)._M_dataplus._M_p = (pointer)&(this->CLIENT_SEND_FRAGMENT).field_2;
  (this->CLIENT_SEND_FRAGMENT)._M_string_length = 0;
  (this->CLIENT_SEND_FRAGMENT).field_2._M_local_buf[0] = '\0';
  (this->CLIENT_RECV_FRAGMENT)._M_dataplus._M_p = (pointer)&(this->CLIENT_RECV_FRAGMENT).field_2;
  (this->CLIENT_RECV_FRAGMENT)._M_string_length = 0;
  (this->CLIENT_RECV_FRAGMENT).field_2._M_local_buf[0] = '\0';
  (this->SERVER_SEND_FRAGMENT)._M_dataplus._M_p = (pointer)&(this->SERVER_SEND_FRAGMENT).field_2;
  (this->SERVER_SEND_FRAGMENT)._M_string_length = 0;
  (this->SERVER_SEND_FRAGMENT).field_2._M_local_buf[0] = '\0';
  (this->SERVER_RECV_FRAGMENT)._M_dataplus._M_p = (pointer)&(this->SERVER_RECV_FRAGMENT).field_2;
  (this->SERVER_RECV_FRAGMENT)._M_string_length = 0;
  (this->SERVER_RECV_FRAGMENT).field_2._M_local_buf[0] = '\0';
  (this->LOCAL_COMPONENT)._M_dataplus._M_p = (pointer)&(this->LOCAL_COMPONENT).field_2;
  (this->LOCAL_COMPONENT)._M_string_length = 0;
  (this->LOCAL_COMPONENT).field_2._M_local_buf[0] = '\0';
  (this->CLIENT_ADDR)._M_dataplus._M_p = (pointer)&(this->CLIENT_ADDR).field_2;
  (this->CLIENT_ADDR)._M_string_length = 0;
  (this->CLIENT_ADDR).field_2._M_local_buf[0] = '\0';
  (this->SERVER_ADDR)._M_dataplus._M_p = (pointer)&(this->SERVER_ADDR).field_2;
  (this->SERVER_ADDR)._M_string_length = 0;
  (this->SERVER_ADDR).field_2._M_local_buf[0] = '\0';
  (this->MESSAGE_ADDR)._M_dataplus._M_p = (pointer)&(this->MESSAGE_ADDR).field_2;
  (this->MESSAGE_ADDR)._M_string_length = 0;
  (this->MESSAGE_ADDR).field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::assign((char *)this);
  std::__cxx11::string::assign((char *)&this->CLIENT_RECV);
  std::__cxx11::string::assign((char *)&this->SERVER_SEND);
  std::__cxx11::string::assign((char *)&this->SERVER_RECV);
  std::__cxx11::string::assign((char *)&this->MESSAGE_SEND);
  std::__cxx11::string::assign((char *)&this->MESSAGE_RECV);
  std::__cxx11::string::assign((char *)&this->WIRE_SEND);
  std::__cxx11::string::assign((char *)&this->WIRE_RECV);
  std::__cxx11::string::assign((char *)&this->CLIENT_SEND_FRAGMENT);
  std::__cxx11::string::assign((char *)&this->CLIENT_RECV_FRAGMENT);
  std::__cxx11::string::assign((char *)&this->SERVER_SEND_FRAGMENT);
  std::__cxx11::string::assign((char *)&this->SERVER_RECV_FRAGMENT);
  std::__cxx11::string::assign((char *)&this->LOCAL_COMPONENT);
  std::__cxx11::string::assign((char *)&this->CLIENT_ADDR);
  std::__cxx11::string::assign((char *)&this->SERVER_ADDR);
  std::__cxx11::string::assign((char *)&this->MESSAGE_ADDR);
  return;
}

Assistant:

zipkincoreConstants::zipkincoreConstants() {
  CLIENT_SEND = "cs";

  CLIENT_RECV = "cr";

  SERVER_SEND = "ss";

  SERVER_RECV = "sr";

  MESSAGE_SEND = "ms";

  MESSAGE_RECV = "mr";

  WIRE_SEND = "ws";

  WIRE_RECV = "wr";

  CLIENT_SEND_FRAGMENT = "csf";

  CLIENT_RECV_FRAGMENT = "crf";

  SERVER_SEND_FRAGMENT = "ssf";

  SERVER_RECV_FRAGMENT = "srf";

  LOCAL_COMPONENT = "lc";

  CLIENT_ADDR = "ca";

  SERVER_ADDR = "sa";

  MESSAGE_ADDR = "ma";

}